

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> PVar1;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  local_40;
  
  this_00 = (CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_> *)
            operator_new(0x28);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<std::tuple<char_const*,char_const*>>>
  ::
  _Tuple_impl<testing::internal::ValueArray<char_const*>,testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<char_const*>>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<std::tuple<char_const*,char_const*>>>
              *)&local_40,in_RSI);
  CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_>::
  CartesianProductGenerator
            (this_00,(tuple<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
                      *)&local_40);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<char_const*,std::tuple<char_const*,char_const*>>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<char_const*,std::tuple<char_const*,char_const*>>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<char_const*,std::tuple<char_const*,char_const*>>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>
                      *)this_00);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  ::~_Tuple_impl(&local_40);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }